

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O0

bool fmt::impl::parse_integer<char,long>(char **format,long *val)

{
  char *pcVar1;
  long digit;
  long maxval10;
  long maxval;
  long lStack_28;
  char ch;
  long v;
  long *val_local;
  char **format_local;
  
  lStack_28 = 0;
  maxval._7_1_ = **format;
  while( true ) {
    if (maxval._7_1_ < '0' || '9' < maxval._7_1_) {
      *val = lStack_28;
      return true;
    }
    if (0xccccccccccccccc < lStack_28) break;
    if (0x7fffffffffffffff - (long)(maxval._7_1_ + -0x30) < lStack_28 * 10) {
      return false;
    }
    lStack_28 = (long)(maxval._7_1_ + -0x30) + lStack_28 * 10;
    pcVar1 = *format;
    *format = pcVar1 + 1;
    maxval._7_1_ = pcVar1[1];
  }
  return false;
}

Assistant:

bool parse_integer(const CharT*& format, T& val) {
   T v{};
   CharT ch = *format;
   constexpr T maxval = std::numeric_limits<T>::max();
   constexpr T maxval10 = maxval / 10;
   while (ch >= '0' && ch <= '9') {
      T digit = ch - '0';
      if (v > maxval10) return false;
      v *= 10;
      if (v > maxval - digit) return false;
      v += digit;
      ch = *++format;
   }
   val = v;
   return true;
}